

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall HighsSymmetries::mergeOrbits(HighsSymmetries *this,HighsInt v1,HighsInt v2)

{
  int iVar1;
  HighsInt HVar2;
  HighsInt HVar3;
  reference pvVar4;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  HighsInt orbit2;
  HighsInt orbit1;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar5;
  undefined4 in_stack_ffffffffffffffec;
  
  if (in_ESI != in_EDX) {
    HVar3 = (HighsInt)((ulong)in_RDI >> 0x20);
    HVar2 = getOrbit((HighsSymmetries *)
                     CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),HVar3);
    HVar3 = getOrbit((HighsSymmetries *)CONCAT44(HVar2,in_stack_ffffffffffffffe8),HVar3);
    if (HVar2 != HVar3) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),(long)HVar3);
      iVar1 = *pvVar4;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),(long)HVar2);
      if (iVar1 < *pvVar4) {
        iVar5 = HVar2;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)HVar3);
        *pvVar4 = HVar2;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),(long)HVar3);
        iVar1 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),(long)iVar5);
        *pvVar4 = iVar1 + *pvVar4;
      }
      else {
        iVar5 = HVar3;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)HVar2);
        *pvVar4 = HVar3;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),(long)HVar2);
        iVar1 = *pvVar4;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),(long)iVar5);
        *pvVar4 = iVar1 + *pvVar4;
      }
    }
  }
  return;
}

Assistant:

void HighsSymmetries::mergeOrbits(HighsInt v1, HighsInt v2) {
  if (v1 == v2) return;

  HighsInt orbit1 = getOrbit(v1);
  HighsInt orbit2 = getOrbit(v2);

  if (orbit1 == orbit2) return;

  if (orbitSize[orbit2] < orbitSize[orbit1]) {
    orbitPartition[orbit2] = orbit1;
    orbitSize[orbit1] += orbitSize[orbit2];
  } else {
    orbitPartition[orbit1] = orbit2;
    orbitSize[orbit2] += orbitSize[orbit1];
  }

  return;
}